

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ssize_t rw::Image::read(int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  char *__dest;
  long lVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined4 in_register_0000003c;
  long lVar7;
  
  sVar1 = strlen((char *)CONCAT44(in_register_0000003c,__fd));
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/image.cpp line: 999"
  ;
  __dest = (char *)(*DAT_00149858)(sVar1 + 0x14,0x10018);
  strcpy(__dest,(char *)CONCAT44(in_register_0000003c,__fd));
  sVar1 = strlen(__dest);
  __dest[sVar1] = '.';
  uVar5 = (ulong)(int)imageModuleOffset;
  if (0 < *(int *)(engine + 0x100 + uVar5)) {
    lVar2 = uVar5 + engine;
    lVar7 = 0x18;
    lVar6 = 0;
    lVar4 = engine;
    do {
      if (*(long *)(lVar2 + lVar7) != 0) {
        strncpy(__dest + sVar1 + 1,*(char **)(lVar2 + -8 + lVar7),0x13);
        pcVar3 = getFilename(__dest);
        uVar5 = (ulong)imageModuleOffset;
        lVar4 = engine;
        if (pcVar3 != (char *)0x0) {
          lVar2 = (**(code **)(lVar7 + engine + (int)imageModuleOffset))(pcVar3);
          (*DAT_00149850)(pcVar3);
          if (lVar2 != 0) goto LAB_0010f6a7;
          uVar5 = (ulong)imageModuleOffset;
          lVar4 = engine;
        }
      }
      lVar6 = lVar6 + 1;
      lVar2 = lVar4 + (int)uVar5;
      lVar7 = lVar7 + 0x18;
    } while (lVar6 < *(int *)(lVar4 + 0x100 + (long)(int)uVar5));
  }
  lVar2 = 0;
LAB_0010f6a7:
  (*DAT_00149850)(__dest);
  return lVar2;
}

Assistant:

Image*
Image::read(const char *imageName)
{
	int i;
	char *filename, *ext, *found;
	Image *img;

	filename = rwNewT(char, strlen(imageName) + 20, MEMDUR_FUNCTION | ID_IMAGE);
	strcpy(filename, imageName);
	ext = filename + strlen(filename);
	*ext++ = '.';
	// Try all supported extensions
	for(i = 0; i < IMAGEGLOBAL(numFileFormats); i++){
		if(IMAGEGLOBAL(fileFormats)[i].read == nil)
			continue;
		strncpy(ext, IMAGEGLOBAL(fileFormats)[i].extension, 19);
		found = getFilename(filename);
		// Found a file
		if(found){
			img = IMAGEGLOBAL(fileFormats)[i].read(found);
			rwFree(found);
			// It was a valid image of that format
			if(img){
				rwFree(filename);
				return img;
			}
		}
	}
	rwFree(filename);
	return nil;
}